

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qauthenticator.cpp
# Opt level: O1

void __thiscall QAuthenticator::setUser(QAuthenticator *this,QString *user)

{
  QAuthenticatorPrivate *pQVar1;
  long lVar2;
  long lVar3;
  char cVar4;
  QStringView QVar5;
  QStringView QVar6;
  
  pQVar1 = this->d;
  if (pQVar1 != (QAuthenticatorPrivate *)0x0) {
    lVar2 = (pQVar1->user).d.size;
    lVar3 = (user->d).size;
    if (lVar2 == lVar3) {
      QVar5.m_data = (pQVar1->user).d.ptr;
      QVar5.m_size = lVar2;
      QVar6.m_data = (user->d).ptr;
      QVar6.m_size = lVar3;
      cVar4 = QtPrivate::equalStrings(QVar5,QVar6);
      if (cVar4 != '\0') {
        return;
      }
    }
  }
  detach(this);
  QString::operator=(&this->d->user,(QString *)user);
  QAuthenticatorPrivate::updateCredentials(this->d);
  return;
}

Assistant:

void QAuthenticator::setUser(const QString &user)
{
    if (!d || d->user != user) {
        detach();
        d->user = user;
        d->updateCredentials();
    }
}